

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::samplers::Sampler_testGuaranteedThroughputProbabilisticSamplerUpdate_Test::TestBody
          (Sampler_testGuaranteedThroughputProbabilisticSamplerUpdate_Test *this)

{
  char cVar1;
  char *pcVar2;
  double newLowerBound;
  AssertionResult gtest_ar;
  double newSamplingRate;
  double samplingRate;
  double lowerBound;
  GuaranteedThroughputProbabilisticSampler sampler;
  long *local_b8;
  long *local_b0;
  internal local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  long *local_98;
  double local_90;
  double local_88;
  double local_80;
  GuaranteedThroughputProbabilisticSampler local_78;
  
  local_80 = 2.0;
  local_88 = 0.5;
  GuaranteedThroughputProbabilisticSampler::GuaranteedThroughputProbabilisticSampler
            (&local_78,2.0,0.5);
  local_b0 = (long *)local_78._lowerBound;
  testing::internal::CmpHelperEQ<double,double>
            (local_a8,"lowerBound","sampler.lowerBound()",&local_80,(double *)&local_b0);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_b0 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_b0 != (long *)0x0)) {
        (**(code **)(*local_b0 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_b0 = (long *)local_78._samplingRate;
    testing::internal::CmpHelperEQ<double,double>
              (local_a8,"samplingRate","sampler.samplingRate()",&local_88,(double *)&local_b0);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b0);
      if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_a0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0xcc,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
      if (local_b0 != (long *)0x0) {
        cVar1 = testing::internal::IsTrue(true);
        if ((cVar1 != '\0') && (local_b0 != (long *)0x0)) {
          (**(code **)(*local_b0 + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_b0 = (long *)&DAT_3ff0000000000000;
      local_90 = 0.6;
      jaegertracing::samplers::GuaranteedThroughputProbabilisticSampler::update(1.0,0.6);
      local_b8 = (long *)local_78._lowerBound;
      testing::internal::CmpHelperEQ<double,double>
                (local_a8,"newLowerBound","sampler.lowerBound()",(double *)&local_b0,
                 (double *)&local_b8);
      if (local_a8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_b8);
        if (local_a0.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_a0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0xd1,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
        if (local_b8 != (long *)0x0) {
          cVar1 = testing::internal::IsTrue(true);
          if ((cVar1 != '\0') && (local_b8 != (long *)0x0)) {
            (**(code **)(*local_b8 + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_b8 = (long *)local_78._samplingRate;
        testing::internal::CmpHelperEQ<double,double>
                  (local_a8,"newSamplingRate","sampler.samplingRate()",&local_90,(double *)&local_b8
                  );
        if (local_a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_b8);
          if (local_a0.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((local_a0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0xd2,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_b8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
          if (local_b8 != (long *)0x0) {
            cVar1 = testing::internal::IsTrue(true);
            if ((cVar1 != '\0') && (local_b8 != (long *)0x0)) {
              (**(code **)(*local_b8 + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_90 = 1.1;
          jaegertracing::samplers::GuaranteedThroughputProbabilisticSampler::update
                    ((double)local_b0,1.1);
          local_b8 = (long *)&DAT_3ff0000000000000;
          local_98 = (long *)local_78._samplingRate;
          testing::internal::CmpHelperEQ<double,double>
                    (local_a8,"1.0","sampler.samplingRate()",(double *)&local_b8,(double *)&local_98
                    );
          if (local_a8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_b8);
            if (local_a0.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((local_a0.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_98,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0xd6,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_98,(Message *)&local_b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
            if (local_b8 != (long *)0x0) {
              cVar1 = testing::internal::IsTrue(true);
              if ((cVar1 != '\0') && (local_b8 != (long *)0x0)) {
                (**(code **)(*local_b8 + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
      }
    }
  }
  local_78.super_Sampler._vptr_Sampler =
       (_func_int **)&PTR__GuaranteedThroughputProbabilisticSampler_0020df38;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_78._tags);
  if ((__uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
       )local_78._lowerBoundSampler._M_t.
        super___uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
        ._M_t.
        super__Tuple_impl<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
        .super__Head_base<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_false>._M_head_impl
      != (__uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
          )0x0) {
    (**(code **)(*(long *)local_78._lowerBoundSampler._M_t.
                          super___uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
                          .
                          super__Head_base<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_false>
                          ._M_head_impl + 8))();
  }
  local_78._lowerBoundSampler._M_t.
  super___uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
  .super__Head_base<0UL,_jaegertracing::samplers::RateLimitingSampler_*,_false>._M_head_impl =
       (__uniq_ptr_data<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>,_true,_true>
        )(__uniq_ptr_impl<jaegertracing::samplers::RateLimitingSampler,_std::default_delete<jaegertracing::samplers::RateLimitingSampler>_>
          )0x0;
  local_78._probabilisticSampler.super_Sampler._vptr_Sampler =
       (_func_int **)&PTR__ProbabilisticSampler_0020dcc8;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
            (&local_78._probabilisticSampler._tags);
  return;
}

Assistant:

TEST(Sampler, testGuaranteedThroughputProbabilisticSamplerUpdate)
{
    auto lowerBound = 2.0;
    auto samplingRate = 0.5;
    GuaranteedThroughputProbabilisticSampler sampler(lowerBound, samplingRate);
    ASSERT_EQ(lowerBound, sampler.lowerBound());
    ASSERT_EQ(samplingRate, sampler.samplingRate());

    auto newLowerBound = 1.0;
    auto newSamplingRate = 0.6;
    sampler.update(newLowerBound, newSamplingRate);
    ASSERT_EQ(newLowerBound, sampler.lowerBound());
    ASSERT_EQ(newSamplingRate, sampler.samplingRate());

    newSamplingRate = 1.1;
    sampler.update(newLowerBound, newSamplingRate);
    ASSERT_EQ(1.0, sampler.samplingRate());
}